

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void expr_to_jmp(Parser *psr,Node *node)

{
  int jmp_idx;
  
  expr_discharge(psr,node);
  if (node->type - NODE_PRIM < 3) {
    expr_to_next_slot(psr,node);
  }
  else if (node->type != NODE_NON_RELOC) {
    return;
  }
  fn_emit(psr->vm->fns + psr->scope->fn,(uint)(node->field_1).slot << 8 | 0x30011);
  jmp_idx = fn_emit(psr->vm->fns + psr->scope->fn,0x1d);
  jmp_set_target(psr,jmp_idx,-1);
  node->type = NODE_JMP;
  (node->field_1).reloc_idx = jmp_idx;
  (node->field_1).jmp.false_list = -1;
  return;
}

Assistant:

static void expr_to_jmp(Parser *psr, Node *node) {
	// Only deal with discharged nodes
	expr_discharge(psr, node);

	switch (node->type) {
	case NODE_RELOC: case NODE_PRIM: case NODE_CONST:
		// Dishcarge relocations and constants to stack slots for comparison;
		// we don't bother trying to fold constants because we likely already
		// emitted bytecode for the left operand we don't want to have to undo
		expr_to_next_slot(psr, node);

		// Fall through to the non-reloc case...

	case NODE_NON_RELOC: {
		// Emit a jump on the truthness of the value
		fn_emit(psr_fn(psr), bc_new2(BC_EQ_LP, node->slot, PRIM_TRUE));
		int jmp_idx = fn_emit(psr_fn(psr), bc_new1(BC_JMP, 0));
		jmp_set_target(psr, jmp_idx, -1);

		// Set the result
		node->type = NODE_JMP;
		node->jmp.true_list = jmp_idx;
		node->jmp.false_list = -1;
		break;
	}

	default:
		// The only other operand type is NODE_JMP, which we don't do anything
		// with
		break;
	}
}